

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formular_inline.h
# Opt level: O3

float formularAllShipAtk(int *shipAtk)

{
  int iVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  
  iVar4 = armor_min;
  iVar3 = armor_max;
  fVar2 = accu_coef;
  iVar1 = armor;
  lVar8 = (long)carrierNum;
  if (lVar8 < 1) {
    fVar10 = 0.0;
  }
  else {
    piVar9 = &(theCarrier.super__Vector_base<Carrier,_std::allocator<Carrier>_>._M_impl.
               super__Vector_impl_data._M_start)->atk;
    fVar10 = 0.0;
    lVar7 = 0;
    do {
      if (shipAtk[lVar7] != 0) {
        iVar5 = (int)((double)(shipAtk[lVar7] / 10 + *piVar9) * 1.5);
        iVar6 = iVar5 + 0x37;
        if (0x7d < iVar5) {
          dVar12 = floor(SQRT((double)(iVar5 + -0x7d)));
          iVar6 = (int)(dVar12 + 180.0);
        }
        iVar6 = (int)(float)iVar6;
        if (iVar6 < iVar3) {
          fVar13 = 0.0;
          if (iVar6 - iVar4 != 0 && iVar4 <= iVar6) {
            fVar13 = (float)((iVar6 - iVar4) / 2);
          }
        }
        else {
          fVar13 = (float)(iVar6 - iVar1);
        }
        iVar6 = (int)((double)(iVar5 + 0x37) * 0.8);
        if (0xb4 < iVar6) {
          dVar12 = floor(SQRT((double)(iVar6 + -0xb4)));
          iVar6 = (int)(dVar12 + 180.0);
        }
        iVar6 = (int)(float)iVar6;
        if (iVar6 < iVar3) {
          fVar11 = 0.0;
          if (iVar6 - iVar4 != 0 && iVar4 <= iVar6) {
            fVar11 = (float)((iVar6 - iVar4) / 2);
          }
        }
        else {
          fVar11 = (float)(iVar6 - iVar1);
        }
        fVar10 = fVar10 + (SQRT((float)(int)lVar7) * fVar2 + 1.0) * (fVar13 * 0.6 + fVar11 * 0.4);
      }
      lVar7 = lVar7 + 1;
      piVar9 = piVar9 + 0x10;
    } while (lVar8 != lVar7);
  }
  return fVar10;
}

Assistant:

inline float formularAllShipAtk(int shipAtk[]){
    float res=0;
    for(int i=0;i<carrierNum;i++){
        if(shipAtk[i] == 0) continue;//��վ
        int rawDamage = formula_shipAtk_rawDamage(shipAtk[i], theCarrier[i].atk);
        res += (armorSimu(formula_shipAtk_cocurHeading(rawDamage))*0.6 + armorSimu(formula_shipAtk_invertHeading(rawDamage))*0.4) * (1+accu_coef*sqrt(i));
    }
    return res;
}